

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O0

void __thiscall Fl_Graphics_Driver::point(Fl_Graphics_Driver *this,int x,int y)

{
  Display *pDVar1;
  Window WVar2;
  GC p_Var3;
  int iVar4;
  int iVar5;
  int y_local;
  int x_local;
  Fl_Graphics_Driver *this_local;
  
  p_Var3 = fl_gc;
  WVar2 = fl_window;
  pDVar1 = fl_display;
  iVar4 = clip_x(x);
  iVar5 = clip_x(y);
  XDrawPoint(pDVar1,WVar2,p_Var3,iVar4,iVar5);
  return;
}

Assistant:

void Fl_Graphics_Driver::point(int x, int y) {
#if defined(USE_X11)
  XDrawPoint(fl_display, fl_window, fl_gc, clip_x(x), clip_x(y));
#elif defined(WIN32)
  SetPixel(fl_gc, x, y, fl_RGB());
#elif defined(__APPLE_QUARTZ__)
  CGContextFillRect(fl_gc, CGRectMake(x - 0.5, y - 0.5, 1, 1) );
#else
# error unsupported platform
#endif
}